

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo640.c
# Opt level: O3

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss,uint8_t *ct,uint8_t *sk)

{
  ushort *puVar1;
  uint16_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  uint3 uVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  uint8_t uVar39;
  undefined8 uVar40;
  uint16_t uVar41;
  uint32_t i0;
  long lVar42;
  uint16_t *puVar43;
  uint32_t i1;
  uint16_t *puVar44;
  short *psVar45;
  uint7 *puVar46;
  uint8_t *puVar47;
  uint8_t *seed;
  uint32_t i0_1;
  uint uVar48;
  uint16_t *__s;
  ulong uVar49;
  long lVar50;
  uint16_t *puVar51;
  int iVar52;
  ulong uVar53;
  long lVar54;
  short *psVar55;
  uint16_t sample0_2;
  long lVar56;
  uint16_t res_1;
  ushort *__s_00;
  uint32_t i_1;
  uint uVar57;
  uint32_t i0_2;
  short sVar58;
  undefined4 uVar59;
  short sVar63;
  short sVar64;
  undefined4 uVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar61 [16];
  undefined1 uVar71;
  undefined4 uVar72;
  undefined1 uVar76;
  undefined4 uVar77;
  undefined1 auVar74 [16];
  undefined8 uVar78;
  uint uVar79;
  undefined4 uVar80;
  undefined4 uVar84;
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined8 uVar89;
  undefined4 uVar90;
  undefined4 uVar95;
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined4 uVar101;
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined8 uVar108;
  ushort uVar112;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined8 uVar113;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined8 uVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined4 uVar127;
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  uint8_t auStack_de9e8 [9720];
  undefined8 uStack_dc3f0;
  undefined8 uStack_dc3e8;
  undefined8 uStack_dc3e0;
  undefined8 uStack_dc3d8;
  undefined8 uStack_dc3d0;
  undefined8 uStack_dc3c8;
  uint8_t auStack_dc3c0 [8];
  short asStack_dc3b8 [4];
  uint16_t a_matrix [409600];
  uint8_t r [20608];
  uint16_t local_cb38;
  undefined1 auStack_cb36 [6];
  uint16_t b_matrix [5120];
  uint16_t auStack_7b38 [4];
  uint16_t bpp_matrix [5120];
  ushort uStack_2b46;
  ulong uStack_2b44;
  ushort auStack_2b3c [3];
  undefined1 auStack_2b36 [6];
  uint16_t bp_matrix [5120];
  undefined1 auStack_318 [8];
  uint8_t seed_se_k [32];
  undefined8 uStack_2e8;
  uint16_t mu_encode [64];
  short asStack_260 [4];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 auStack_1e8 [8];
  uint16_t m_matrix [64];
  uint16_t c_matrix [64];
  uint16_t cp_matrix [64];
  undefined1 auStack_48 [8];
  uint8_t mu_decode [16];
  ulong uVar5;
  undefined1 auVar60 [12];
  undefined1 auVar62 [16];
  undefined1 auVar73 [12];
  undefined1 auVar75 [16];
  undefined1 auVar81 [12];
  undefined1 auVar83 [16];
  undefined1 auVar91 [12];
  undefined1 auVar93 [16];
  undefined8 uVar96;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined8 uVar102;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined4 uVar120;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  
  __s_00 = auStack_2b3c + 2;
  builtin_memcpy(auStack_dc3c0,"¹\x16",4);
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  cp_matrix._120_8_ = ss;
  memset(__s_00,0,0x2800);
  c_matrix[0x34] = 0;
  c_matrix[0x35] = 0;
  c_matrix[0x36] = 0;
  c_matrix[0x37] = 0;
  c_matrix[0x38] = 0;
  c_matrix[0x39] = 0;
  c_matrix[0x3a] = 0;
  c_matrix[0x3b] = 0;
  c_matrix[0x2c] = 0;
  c_matrix[0x2d] = 0;
  c_matrix[0x2e] = 0;
  c_matrix[0x2f] = 0;
  c_matrix[0x30] = 0;
  c_matrix[0x31] = 0;
  c_matrix[0x32] = 0;
  c_matrix[0x33] = 0;
  c_matrix[0x24] = 0;
  c_matrix[0x25] = 0;
  c_matrix[0x26] = 0;
  c_matrix[0x27] = 0;
  c_matrix[0x28] = 0;
  c_matrix[0x29] = 0;
  c_matrix[0x2a] = 0;
  c_matrix[0x2b] = 0;
  c_matrix[0x1c] = 0;
  c_matrix[0x1d] = 0;
  c_matrix[0x1e] = 0;
  c_matrix[0x1f] = 0;
  c_matrix[0x20] = 0;
  c_matrix[0x21] = 0;
  c_matrix[0x22] = 0;
  c_matrix[0x23] = 0;
  c_matrix[0x14] = 0;
  c_matrix[0x15] = 0;
  c_matrix[0x16] = 0;
  c_matrix[0x17] = 0;
  c_matrix[0x18] = 0;
  c_matrix[0x19] = 0;
  c_matrix[0x1a] = 0;
  c_matrix[0x1b] = 0;
  c_matrix[0xc] = 0;
  c_matrix[0xd] = 0;
  c_matrix[0xe] = 0;
  c_matrix[0xf] = 0;
  c_matrix[0x10] = 0;
  c_matrix[0x11] = 0;
  c_matrix[0x12] = 0;
  c_matrix[0x13] = 0;
  c_matrix[4] = 0;
  c_matrix[5] = 0;
  c_matrix[6] = 0;
  c_matrix[7] = 0;
  c_matrix[8] = 0;
  c_matrix[9] = 0;
  c_matrix[10] = 0;
  c_matrix[0xb] = 0;
  stack0xfffffffffffffe98 = (undefined1  [16])0x0;
  lVar42 = 0xe;
  puVar46 = (uint7 *)ct;
  do {
    uVar53 = (ulong)*(uint3 *)((long)puVar46 + 4) << 0x20;
    uVar48 = (uint)*puVar46;
    uVar49 = *(ulong *)((long)puVar46 + 7);
    uVar6 = (uVar53 & 0xff0000000000) >> 0x18;
    uVar3 = uVar6 | (uVar53 & 0xff00000000) >> 8 | ((ulong)uVar48 & 0xff000000) << 8;
    uVar4 = uVar49 >> 0x38 | (uVar49 & 0xff000000000000) >> 0x28;
    uVar5 = uVar4 | (uVar49 & 0xff0000000000) >> 0x18 | (uVar49 & 0xff00000000) >> 8;
    uVar49 = uVar5 | (uVar49 & 0xff000000) << 8 | (uVar49 & 0xff0000) << 0x18 |
             (uVar49 & 0xff00) << 0x28 | uVar49 << 0x38;
    *(ushort *)((long)&uStack_2b46 + lVar42) =
         (ushort)((ushort)(((ulong)uVar48 & 0xff00) >> 8) |
                 (ushort)(((ulong)*puVar46 << 0x38) >> 0x30)) >> 1;
    *(ulong *)((long)auStack_2b3c + lVar42 + -8) =
         (((uVar3 | ((ulong)uVar48 & 0xff0000) << 0x18 | ((ulong)uVar48 & 0xff00) << 0x28) &
          0x3fffc00000000) >> 0x22 | ((uVar3 & 0x7fff80000) >> 0x13) << 0x10 |
          (ulong)(ushort)((ushort)(uVar49 >> 0x3c) |
                         (ushort)(((uVar53 & 0xff000000000000) >> 0x28 | uVar6) >> 4)) << 0x20 |
         (uVar49 >> 0x2d) << 0x30) & 0x7fff7fff7fff7fff;
    *(ushort *)((long)auStack_2b3c + lVar42) = (ushort)(uVar49 >> 0x1e) & 0x7fff;
    *(ushort *)((long)auStack_2b3c + lVar42 + 2) = (ushort)(uVar5 >> 0xf) & 0x7fff;
    *(ushort *)(auStack_2b36 + lVar42 + -2) = (ushort)uVar4 & 0x7fff;
    lVar42 = lVar42 + 0x10;
    puVar46 = (uint7 *)((long)puVar46 + 0xf);
  } while (lVar42 != 0x280e);
  puVar46 = (uint7 *)(ct + 0x2580);
  lVar42 = 0xe;
  do {
    uVar53 = (ulong)*(uint3 *)((long)puVar46 + 4) << 0x20;
    uVar48 = (uint)*puVar46;
    uVar49 = *(ulong *)((long)puVar46 + 7);
    uVar6 = (uVar53 & 0xff0000000000) >> 0x18;
    uVar3 = uVar6 | (uVar53 & 0xff00000000) >> 8 | ((ulong)uVar48 & 0xff000000) << 8;
    uVar5 = uVar49 >> 0x38 | (uVar49 & 0xff000000000000) >> 0x28;
    uVar4 = uVar5 | (uVar49 & 0xff0000000000) >> 0x18 | (uVar49 & 0xff00000000) >> 8;
    uVar49 = uVar4 | (uVar49 & 0xff000000) << 8 | (uVar49 & 0xff0000) << 0x18 |
             (uVar49 & 0xff00) << 0x28 | uVar49 << 0x38;
    *(ushort *)((long)m_matrix + lVar42 + 0x6a) =
         (ushort)((ushort)(((ulong)uVar48 & 0xff00) >> 8) |
                 (ushort)(((ulong)*puVar46 << 0x38) >> 0x30)) >> 1;
    *(ulong *)((long)m_matrix + lVar42 + 0x6c) =
         (((uVar3 | ((ulong)uVar48 & 0xff0000) << 0x18 | ((ulong)uVar48 & 0xff00) << 0x28) &
          0x3fffc00000000) >> 0x22 | ((uVar3 & 0x7fff80000) >> 0x13) << 0x10 |
          (ulong)(ushort)((ushort)(uVar49 >> 0x3c) |
                         (ushort)(((uVar53 & 0xff000000000000) >> 0x28 | uVar6) >> 4)) << 0x20 |
         (uVar49 >> 0x2d) << 0x30) & 0x7fff7fff7fff7fff;
    *(ushort *)((long)m_matrix + lVar42 + 0x74) = (ushort)(uVar49 >> 0x1e) & 0x7fff;
    *(ushort *)((long)m_matrix + lVar42 + 0x76) = (ushort)(uVar4 >> 0xf) & 0x7fff;
    *(ushort *)((long)m_matrix + lVar42 + 0x78) = (ushort)uVar5 & 0x7fff;
    lVar42 = lVar42 + 0x10;
    puVar46 = (uint7 *)((long)puVar46 + 0xf);
  } while (lVar42 != 0x8e);
  _auStack_48 = (undefined1  [16])0x0;
  m_matrix[0x34] = 0;
  m_matrix[0x35] = 0;
  m_matrix[0x36] = 0;
  m_matrix[0x37] = 0;
  m_matrix[0x38] = 0;
  m_matrix[0x39] = 0;
  m_matrix[0x3a] = 0;
  m_matrix[0x3b] = 0;
  m_matrix[0x2c] = 0;
  m_matrix[0x2d] = 0;
  m_matrix[0x2e] = 0;
  m_matrix[0x2f] = 0;
  m_matrix[0x30] = 0;
  m_matrix[0x31] = 0;
  m_matrix[0x32] = 0;
  m_matrix[0x33] = 0;
  m_matrix[0x24] = 0;
  m_matrix[0x25] = 0;
  m_matrix[0x26] = 0;
  m_matrix[0x27] = 0;
  m_matrix[0x28] = 0;
  m_matrix[0x29] = 0;
  m_matrix[0x2a] = 0;
  m_matrix[0x2b] = 0;
  m_matrix[0x1c] = 0;
  m_matrix[0x1d] = 0;
  m_matrix[0x1e] = 0;
  m_matrix[0x1f] = 0;
  m_matrix[0x20] = 0;
  m_matrix[0x21] = 0;
  m_matrix[0x22] = 0;
  m_matrix[0x23] = 0;
  m_matrix[0x14] = 0;
  m_matrix[0x15] = 0;
  m_matrix[0x16] = 0;
  m_matrix[0x17] = 0;
  m_matrix[0x18] = 0;
  m_matrix[0x19] = 0;
  m_matrix[0x1a] = 0;
  m_matrix[0x1b] = 0;
  m_matrix[0xc] = 0;
  m_matrix[0xd] = 0;
  m_matrix[0xe] = 0;
  m_matrix[0xf] = 0;
  m_matrix[0x10] = 0;
  m_matrix[0x11] = 0;
  m_matrix[0x12] = 0;
  m_matrix[0x13] = 0;
  m_matrix[4] = 0;
  m_matrix[5] = 0;
  m_matrix[6] = 0;
  m_matrix[7] = 0;
  m_matrix[8] = 0;
  m_matrix[9] = 0;
  m_matrix[10] = 0;
  m_matrix[0xb] = 0;
  _auStack_1e8 = (undefined1  [16])0x0;
  auStack_dc3c0[0] = 0xff;
  auStack_dc3c0[1] = 0xbb;
  auStack_dc3c0[2] = '\x16';
  auStack_dc3c0[3] = '\0';
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  memcpy(r + 0x5078,sk + 0x25a0,0x2800);
  lVar42 = 0;
  do {
    lVar50 = 0;
    puVar47 = r + 0x5078;
    do {
      sVar58 = 0;
      sVar63 = 0;
      sVar64 = 0;
      sVar66 = 0;
      sVar67 = 0;
      sVar68 = 0;
      sVar69 = 0;
      sVar70 = 0;
      lVar54 = 0;
      do {
        psVar45 = (short *)(puVar47 + lVar54 * 2);
        puVar1 = __s_00 + lVar54;
        sVar58 = sVar58 + *psVar45 * *puVar1;
        sVar63 = sVar63 + psVar45[1] * puVar1[1];
        sVar64 = sVar64 + psVar45[2] * puVar1[2];
        sVar66 = sVar66 + psVar45[3] * puVar1[3];
        sVar67 = sVar67 + psVar45[4] * puVar1[4];
        sVar68 = sVar68 + psVar45[5] * puVar1[5];
        sVar69 = sVar69 + psVar45[6] * puVar1[6];
        sVar70 = sVar70 + psVar45[7] * puVar1[7];
        lVar54 = lVar54 + 8;
      } while (lVar54 != 0x280);
      *(short *)(auStack_1e8 + lVar50 * 2 + lVar42 * 0x10) =
           sVar70 + sVar66 + sVar68 + sVar63 + sVar69 + sVar64 + sVar67 + sVar58;
      lVar50 = lVar50 + 1;
      puVar47 = puVar47 + 0x500;
    } while (lVar50 != 8);
    lVar42 = lVar42 + 1;
    __s_00 = __s_00 + 0x280;
  } while (lVar42 != 8);
  lVar42 = 0;
  do {
    sVar58 = *(short *)((long)m_matrix + lVar42 + 0x7a);
    sVar63 = *(short *)((long)m_matrix + lVar42 + 0x7c);
    sVar64 = *(short *)((long)m_matrix + lVar42 + 0x7e);
    sVar66 = *(short *)((long)c_matrix + lVar42);
    sVar67 = *(short *)((long)c_matrix + lVar42 + 2);
    sVar68 = *(short *)((long)c_matrix + lVar42 + 4);
    sVar69 = *(short *)((long)c_matrix + lVar42 + 6);
    sVar70 = *(short *)((long)m_matrix + lVar42);
    sVar17 = *(short *)((long)m_matrix + lVar42 + 2);
    sVar18 = *(short *)((long)m_matrix + lVar42 + 4);
    sVar19 = *(short *)((long)m_matrix + lVar42 + 6);
    *(short *)(auStack_1e8 + lVar42) =
         *(short *)((long)m_matrix + lVar42 + 0x78) - *(short *)(auStack_1e8 + lVar42);
    *(short *)(auStack_1e8 + lVar42 + 2) = sVar58 - *(short *)(auStack_1e8 + lVar42 + 2);
    *(short *)(auStack_1e8 + lVar42 + 4) = sVar63 - *(short *)(auStack_1e8 + lVar42 + 4);
    *(short *)(auStack_1e8 + lVar42 + 6) = sVar64 - *(short *)(auStack_1e8 + lVar42 + 6);
    *(short *)((long)m_matrix + lVar42) = sVar66 - sVar70;
    *(short *)((long)m_matrix + lVar42 + 2) = sVar67 - sVar17;
    *(short *)((long)m_matrix + lVar42 + 4) = sVar68 - sVar18;
    *(short *)((long)m_matrix + lVar42 + 6) = sVar69 - sVar19;
    lVar42 = lVar42 + 0x10;
  } while (lVar42 != 0x80);
  uVar112 = m_matrix[0x23] * 2 + 0x2000 & 0xc000 |
            (ushort)(m_matrix[0x22] + 0x1000) >> 1 & 0x3000 |
            (ushort)(m_matrix[0x21] + 0x1000) >> 3 & 0xc00 |
            (ushort)(m_matrix[0x20] + 0x1000) >> 5 & 0x300 |
            (ushort)(m_matrix[0x1f] + 0x1000) >> 7 & 0xc0 |
            (ushort)(m_matrix[0x1e] + 0x1000) >> 9 & 0x30 |
            (ushort)(m_matrix[0x1d] + 0x1000) >> 0xb & 0xc |
            (ushort)(m_matrix[0x1c] + 0x1000) >> 0xd & 3;
  uVar114 = m_matrix[0x2b] * 2 + 0x2000 & 0xc000 |
            (ushort)(m_matrix[0x2a] + 0x1000) >> 1 & 0x3000 |
            (ushort)(m_matrix[0x29] + 0x1000) >> 3 & 0xc00 |
            (ushort)(m_matrix[0x28] + 0x1000) >> 5 & 0x300 |
            (ushort)(m_matrix[0x27] + 0x1000) >> 7 & 0xc0 |
            (ushort)(m_matrix[0x26] + 0x1000) >> 9 & 0x30 |
            (ushort)(m_matrix[0x25] + 0x1000) >> 0xb & 0xc |
            (ushort)(m_matrix[0x24] + 0x1000) >> 0xd & 3;
  uVar115 = m_matrix[0x33] * 2 + 0x2000 & 0xc000 |
            (ushort)(m_matrix[0x32] + 0x1000) >> 1 & 0x3000 |
            (ushort)(m_matrix[0x31] + 0x1000) >> 3 & 0xc00 |
            (ushort)(m_matrix[0x30] + 0x1000) >> 5 & 0x300 |
            (ushort)(m_matrix[0x2f] + 0x1000) >> 7 & 0xc0 |
            (ushort)(m_matrix[0x2e] + 0x1000) >> 9 & 0x30 |
            (ushort)(m_matrix[0x2d] + 0x1000) >> 0xb & 0xc |
            (ushort)(m_matrix[0x2c] + 0x1000) >> 0xd & 3;
  uVar116 = m_matrix[0x3b] * 2 + 0x2000 & 0xc000 |
            (ushort)(m_matrix[0x3a] + 0x1000) >> 1 & 0x3000 |
            (ushort)(m_matrix[0x39] + 0x1000) >> 3 & 0xc00 |
            (ushort)(m_matrix[0x38] + 0x1000) >> 5 & 0x300 |
            (ushort)(m_matrix[0x37] + 0x1000) >> 7 & 0xc0 |
            (ushort)(m_matrix[0x36] + 0x1000) >> 9 & 0x30 |
            (ushort)(m_matrix[0x35] + 0x1000) >> 0xb & 0xc |
            (ushort)(m_matrix[0x34] + 0x1000) >> 0xd & 3;
  auStack_48._2_2_ =
       m_matrix[0xb] * 2 + 0x2000 & 0xc000 |
       (ushort)(m_matrix[10] + 0x1000) >> 1 & 0x3000 |
       (ushort)(m_matrix[9] + 0x1000) >> 3 & 0xc00 | (ushort)(m_matrix[8] + 0x1000) >> 5 & 0x300 |
       (ushort)(m_matrix[7] + 0x1000) >> 7 & 0xc0 | (ushort)(m_matrix[6] + 0x1000) >> 9 & 0x30 |
       (ushort)(m_matrix[5] + 0x1000) >> 0xb & 0xc | (ushort)(m_matrix[4] + 0x1000) >> 0xd & 3;
  auStack_48._0_2_ =
       m_matrix[3] * 2 + 0x2000 & 0xc000 |
       (ushort)(m_matrix[2] + 0x1000) >> 1 & 0x3000 |
       (ushort)(m_matrix[1] + 0x1000) >> 3 & 0xc00 | (ushort)(m_matrix[0] + 0x1000) >> 5 & 0x300 |
       (ushort)(auStack_1e8._6_2_ + 0x1000) >> 7 & 0xc0 |
       (ushort)(auStack_1e8._4_2_ + 0x1000) >> 9 & 0x30 |
       (ushort)(auStack_1e8._2_2_ + 0x1000) >> 0xb & 0xc |
       (ushort)(auStack_1e8._0_2_ + 0x1000) >> 0xd & 3;
  auStack_48._4_2_ =
       m_matrix[0x13] * 2 + 0x2000 & 0xc000 |
       (ushort)(m_matrix[0x12] + 0x1000) >> 1 & 0x3000 |
       (ushort)(m_matrix[0x11] + 0x1000) >> 3 & 0xc00 |
       (ushort)(m_matrix[0x10] + 0x1000) >> 5 & 0x300 |
       (ushort)(m_matrix[0xf] + 0x1000) >> 7 & 0xc0 | (ushort)(m_matrix[0xe] + 0x1000) >> 9 & 0x30 |
       (ushort)(m_matrix[0xd] + 0x1000) >> 0xb & 0xc | (ushort)(m_matrix[0xc] + 0x1000) >> 0xd & 3;
  auStack_48._6_2_ =
       m_matrix[0x1b] * 2 + 0x2000 & 0xc000 |
       (ushort)(m_matrix[0x1a] + 0x1000) >> 1 & 0x3000 |
       (ushort)(m_matrix[0x19] + 0x1000) >> 3 & 0xc00 |
       (ushort)(m_matrix[0x18] + 0x1000) >> 5 & 0x300 |
       (ushort)(m_matrix[0x17] + 0x1000) >> 7 & 0xc0 | (ushort)(m_matrix[0x16] + 0x1000) >> 9 & 0x30
       | (ushort)(m_matrix[0x15] + 0x1000) >> 0xb & 0xc |
         (ushort)(m_matrix[0x14] + 0x1000) >> 0xd & 3;
  mu_decode[0] = (char)uVar112;
  mu_decode[1] = (char)(uVar112 >> 8);
  mu_decode[2] = (char)uVar114;
  mu_decode[3] = (char)(uVar114 >> 8);
  mu_decode[4] = (char)uVar115;
  mu_decode[5] = (char)(uVar115 >> 8);
  mu_decode[6] = (char)uVar116;
  mu_decode[7] = (char)(uVar116 >> 8);
  builtin_memcpy(auStack_dc3c0,"ƾ\x16",4);
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  Lib_Memzero0_memzero0(r + 0x5078,0x2800);
  builtin_memcpy(auStack_dc3c0,"Ӿ\x16",4);
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  Lib_Memzero0_memzero0(auStack_1e8,0x80);
  auVar61 = _auStack_48;
  seed_se_k[8] = '\0';
  seed_se_k[9] = '\0';
  seed_se_k[10] = '\0';
  seed_se_k[0xb] = '\0';
  seed_se_k[0xc] = '\0';
  seed_se_k[0xd] = '\0';
  seed_se_k[0xe] = '\0';
  seed_se_k[0xf] = '\0';
  seed_se_k[0x10] = '\0';
  seed_se_k[0x11] = '\0';
  seed_se_k[0x12] = '\0';
  seed_se_k[0x13] = '\0';
  seed_se_k[0x14] = '\0';
  seed_se_k[0x15] = '\0';
  seed_se_k[0x16] = '\0';
  seed_se_k[0x17] = '\0';
  _auStack_318 = (undefined1  [16])0x0;
  uStack_dc3d8 = *(undefined8 *)(sk + 0x4da0);
  uStack_dc3d0 = *(undefined8 *)(sk + 0x4da8);
  uStack_dc3c8 = auStack_48;
  auStack_dc3c0[0] = mu_decode[0];
  auStack_dc3c0[1] = mu_decode[1];
  auStack_dc3c0[2] = mu_decode[2];
  auStack_dc3c0[3] = mu_decode[3];
  auStack_dc3c0[4] = mu_decode[4];
  auStack_dc3c0[5] = mu_decode[5];
  auStack_dc3c0[6] = mu_decode[6];
  auStack_dc3c0[7] = mu_decode[7];
  uStack_dc3e0 = 0x16bf21;
  _auStack_48 = auVar61;
  mu_decode._8_8_ = sk;
  Hacl_Hash_SHA3_shake128(auStack_318,0x20,(uint8_t *)&uStack_dc3d8,0x20);
  puVar43 = auStack_7b38;
  lVar42 = 0;
  uStack_dc3e0 = 0x16bf39;
  memset(puVar43,0,0x2800);
  cp_matrix[0x34] = 0;
  cp_matrix[0x35] = 0;
  cp_matrix[0x36] = 0;
  cp_matrix[0x37] = 0;
  cp_matrix[0x38] = 0;
  cp_matrix[0x39] = 0;
  cp_matrix[0x3a] = 0;
  cp_matrix[0x3b] = 0;
  cp_matrix[0x2c] = 0;
  cp_matrix[0x2d] = 0;
  cp_matrix[0x2e] = 0;
  cp_matrix[0x2f] = 0;
  cp_matrix[0x30] = 0;
  cp_matrix[0x31] = 0;
  cp_matrix[0x32] = 0;
  cp_matrix[0x33] = 0;
  cp_matrix[0x24] = 0;
  cp_matrix[0x25] = 0;
  cp_matrix[0x26] = 0;
  cp_matrix[0x27] = 0;
  cp_matrix[0x28] = 0;
  cp_matrix[0x29] = 0;
  cp_matrix[0x2a] = 0;
  cp_matrix[0x2b] = 0;
  cp_matrix[0x1c] = 0;
  cp_matrix[0x1d] = 0;
  cp_matrix[0x1e] = 0;
  cp_matrix[0x1f] = 0;
  cp_matrix[0x20] = 0;
  cp_matrix[0x21] = 0;
  cp_matrix[0x22] = 0;
  cp_matrix[0x23] = 0;
  cp_matrix[0x14] = 0;
  cp_matrix[0x15] = 0;
  cp_matrix[0x16] = 0;
  cp_matrix[0x17] = 0;
  cp_matrix[0x18] = 0;
  cp_matrix[0x19] = 0;
  cp_matrix[0x1a] = 0;
  cp_matrix[0x1b] = 0;
  cp_matrix[0xc] = 0;
  cp_matrix[0xd] = 0;
  cp_matrix[0xe] = 0;
  cp_matrix[0xf] = 0;
  cp_matrix[0x10] = 0;
  cp_matrix[0x11] = 0;
  cp_matrix[0x12] = 0;
  cp_matrix[0x13] = 0;
  cp_matrix[4] = 0;
  cp_matrix[5] = 0;
  cp_matrix[6] = 0;
  cp_matrix[7] = 0;
  cp_matrix[8] = 0;
  cp_matrix[9] = 0;
  cp_matrix[10] = 0;
  cp_matrix[0xb] = 0;
  c_matrix[0x3c] = 0;
  c_matrix[0x3d] = 0;
  c_matrix[0x3e] = 0;
  c_matrix[0x3f] = 0;
  cp_matrix[0] = 0;
  cp_matrix[1] = 0;
  cp_matrix[2] = 0;
  cp_matrix[3] = 0;
  uStack_dc3e0 = 0x16bf84;
  memset(a_matrix + 0x63ffc,0,0x5080);
  bp_matrix[0x13fc]._0_1_ = 0x96;
  stack0xfffffffffffffcc9 = auStack_318;
  uStack_dc3e0 = 0x16bfb0;
  Hacl_Hash_SHA3_shake128
            ((uint8_t *)(a_matrix + 0x63ffc),0x5080,(uint8_t *)(bp_matrix + 0x13fc),0x11);
  uStack_dc3e0 = 0x16bfbd;
  Lib_Memzero0_memzero0(bp_matrix + 0x13fc,0x11);
  puVar51 = bpp_matrix + 0x13fc;
  uStack_dc3e0 = 0x16bfd3;
  memset(puVar51,0,0x2800);
  do {
    lVar50 = 0;
    do {
      lVar54 = lVar50 + lVar42 * 0x280;
      lVar56 = 0;
      iVar52 = 0;
      do {
        iVar52 = iVar52 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table640 + lVar56) -
                            (uint)(a_matrix[lVar54 + 0x63ffc] >> 1) & 0xffff) >> 0xf);
        lVar56 = lVar56 + 2;
      } while (lVar56 != 0x18);
      uVar112 = a_matrix[lVar54 + 0x63ffc] & 1;
      bpp_matrix[lVar54 + 0x13fc] = ((ushort)iVar52 ^ -uVar112) + uVar112;
      lVar50 = lVar50 + 1;
    } while (lVar50 != 0x280);
    lVar42 = lVar42 + 1;
  } while (lVar42 != 8);
  __s = b_matrix + 0x13fc;
  lVar42 = 0;
  uStack_dc3e0 = 0x16c061;
  memset(__s,0,0x2800);
  do {
    lVar50 = 0;
    do {
      lVar54 = lVar50 + lVar42 * 0x280;
      lVar56 = 0;
      iVar52 = 0;
      do {
        iVar52 = iVar52 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table640 + lVar56) -
                            (uint)(*(ushort *)(r + lVar54 * 2 + 0x27f8) >> 1) & 0xffff) >> 0xf);
        lVar56 = lVar56 + 2;
      } while (lVar56 != 0x18);
      uVar112 = *(ushort *)(r + lVar54 * 2 + 0x27f8) & 1;
      b_matrix[lVar54 + 0x13fc] = ((ushort)iVar52 ^ -uVar112) + uVar112;
      lVar50 = lVar50 + 1;
    } while (lVar50 != 0x280);
    lVar42 = lVar42 + 1;
  } while (lVar42 != 8);
  local_1f8 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  stack0xfffffffffffffd98 = (undefined1  [16])0x0;
  lVar42 = 0;
  do {
    puVar44 = (uint16_t *)(lVar42 * 8);
    lVar50 = 0;
    do {
      lVar54 = 0;
      iVar52 = 0;
      do {
        iVar52 = iVar52 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table640 + lVar54) -
                            (uint)(*(ushort *)(r + (lVar50 + (long)puVar44) * 2 + 0x4ff8) >> 1) &
                           0xffff) >> 0xf);
        lVar54 = lVar54 + 2;
      } while (lVar54 != 0x18);
      uVar112 = *(ushort *)(r + (lVar50 + (long)puVar44) * 2 + 0x4ff8) & 1;
      mu_encode[lVar50 + (long)puVar44 + 0x3c] = ((ushort)iVar52 ^ -uVar112) + uVar112;
      lVar50 = lVar50 + 1;
    } while (lVar50 != 8);
    lVar42 = lVar42 + 1;
  } while (lVar42 != 8);
  uVar39 = (uint8_t)mu_decode._8_8_;
  lVar42 = 0;
  uStack_dc3e0 = 0x16c1a7;
  memset(asStack_dc3b8,0,0xc8000);
  uStack_dc3e0 = 0x16c1b3;
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(uVar39 + '\x10',(uint32_t)asStack_dc3b8,seed,puVar44);
  uVar40 = mu_decode._8_8_;
  do {
    lVar50 = 0;
    psVar45 = asStack_dc3b8;
    do {
      lVar54 = 0;
      uVar41 = 0;
      psVar55 = psVar45;
      do {
        uVar41 = uVar41 + *psVar55 * puVar51[lVar54];
        lVar54 = lVar54 + 1;
        psVar55 = psVar55 + 0x280;
      } while (lVar54 != 0x280);
      auStack_7b38[lVar42 * 0x280 + lVar50] = uVar41;
      lVar50 = lVar50 + 1;
      psVar45 = psVar45 + 1;
    } while (lVar50 != 0x280);
    lVar42 = lVar42 + 1;
    puVar51 = puVar51 + 0x280;
  } while (lVar42 != 8);
  lVar42 = 0;
  do {
    lVar50 = 0;
    do {
      puVar51 = __s + lVar50;
      uVar41 = puVar51[1];
      uVar20 = puVar51[2];
      uVar21 = puVar51[3];
      uVar22 = puVar51[4];
      uVar23 = puVar51[5];
      uVar24 = puVar51[6];
      uVar25 = puVar51[7];
      puVar44 = puVar43 + lVar50;
      uVar26 = puVar44[1];
      uVar27 = puVar44[2];
      uVar28 = puVar44[3];
      uVar29 = puVar44[4];
      uVar30 = puVar44[5];
      uVar31 = puVar44[6];
      uVar32 = puVar44[7];
      puVar2 = puVar43 + lVar50;
      *puVar2 = *puVar51 + *puVar44;
      puVar2[1] = uVar41 + uVar26;
      puVar2[2] = uVar20 + uVar27;
      puVar2[3] = uVar21 + uVar28;
      puVar2[4] = uVar22 + uVar29;
      puVar2[5] = uVar23 + uVar30;
      puVar2[6] = uVar24 + uVar31;
      puVar2[7] = uVar25 + uVar32;
      lVar50 = lVar50 + 8;
    } while (lVar50 != 0x280);
    lVar42 = lVar42 + 1;
    __s = __s + 0x280;
    puVar43 = puVar43 + 0x280;
  } while (lVar42 != 8);
  uStack_dc3e0 = 0x16c267;
  memset(&local_cb38,0,0x2800);
  lVar42 = 0x27;
  puVar43 = b_matrix + 3;
  do {
    uVar16 = CONCAT12(*(undefined1 *)(uVar40 + -1 + lVar42),*(undefined2 *)(uVar40 + -3 + lVar42));
    uVar53 = (ulong)uVar16 << 0x20;
    uVar48 = *(uint *)(uVar40 + -7 + lVar42);
    uVar49 = *(ulong *)(uVar40 + lVar42);
    uVar6 = (uVar53 & 0xff0000000000) >> 0x18;
    uVar3 = uVar6 | (uVar53 & 0xff00000000) >> 8 | ((ulong)uVar48 & 0xff000000) << 8;
    uVar5 = uVar49 >> 0x38 | (uVar49 & 0xff000000000000) >> 0x28;
    uVar4 = uVar5 | (uVar49 & 0xff0000000000) >> 0x18 | (uVar49 & 0xff00000000) >> 8;
    uVar49 = uVar4 | (uVar49 & 0xff000000) << 8 | (uVar49 & 0xff0000) << 0x18 |
             (uVar49 & 0xff00) << 0x28 | uVar49 << 0x38;
    puVar43[-7] = (ushort)((ushort)(((ulong)uVar48 & 0xff00) >> 8) |
                          (ushort)(((ulong)CONCAT34(uVar16,uVar48) << 0x38) >> 0x30)) >> 1;
    *(ulong *)(puVar43 + -6) =
         (((uVar3 | ((ulong)uVar48 & 0xff0000) << 0x18 | ((ulong)uVar48 & 0xff00) << 0x28) &
          0x3fffc00000000) >> 0x22 | ((uVar3 & 0x7fff80000) >> 0x13) << 0x10 |
          (ulong)(ushort)((ushort)(uVar49 >> 0x3c) |
                         (ushort)(((uVar53 & 0xff000000000000) >> 0x28 | uVar6) >> 4)) << 0x20 |
         (uVar49 >> 0x2d) << 0x30) & 0x7fff7fff7fff7fff;
    puVar43[-2] = (ushort)(uVar49 >> 0x1e) & 0x7fff;
    puVar43[-1] = (ushort)(uVar4 >> 0xf) & 0x7fff;
    *puVar43 = (ushort)uVar5 & 0x7fff;
    lVar42 = lVar42 + 0xf;
    puVar43 = puVar43 + 8;
  } while (lVar42 != 0x25a7);
  puVar43 = bpp_matrix + 0x13fc;
  lVar42 = 0;
  do {
    lVar50 = 0;
    puVar51 = &local_cb38;
    do {
      lVar54 = 0;
      uVar41 = 0;
      do {
        uVar41 = uVar41 + puVar51[lVar54 * 4] * *(short *)((long)puVar43 + lVar54);
        lVar54 = lVar54 + 2;
      } while (lVar54 != 0x500);
      cp_matrix[lVar42 * 8 + lVar50 + -4] = uVar41;
      lVar50 = lVar50 + 1;
      puVar51 = puVar51 + 1;
    } while (lVar50 != 8);
    lVar42 = lVar42 + 1;
    puVar43 = puVar43 + 0x280;
  } while (lVar42 != 8);
  lVar42 = 0;
  do {
    sVar58 = *(short *)((long)mu_encode + lVar42 + 0x7a);
    sVar63 = *(short *)((long)mu_encode + lVar42 + 0x7c);
    sVar64 = *(short *)((long)mu_encode + lVar42 + 0x7e);
    sVar66 = *(short *)((long)asStack_260 + lVar42);
    sVar67 = *(short *)((long)asStack_260 + lVar42 + 2);
    sVar68 = *(short *)((long)asStack_260 + lVar42 + 4);
    sVar69 = *(short *)(local_258 + lVar42 + -2);
    sVar70 = *(short *)((long)cp_matrix + lVar42);
    sVar17 = *(short *)((long)cp_matrix + lVar42 + 2);
    sVar18 = *(short *)((long)cp_matrix + lVar42 + 4);
    sVar19 = *(short *)((long)cp_matrix + lVar42 + 6);
    *(short *)((long)c_matrix + lVar42 + 0x78) =
         *(short *)((long)mu_encode + lVar42 + 0x78) + *(short *)((long)c_matrix + lVar42 + 0x78);
    *(short *)((long)c_matrix + lVar42 + 0x7a) = sVar58 + *(short *)((long)c_matrix + lVar42 + 0x7a)
    ;
    *(short *)((long)c_matrix + lVar42 + 0x7c) = sVar63 + *(short *)((long)c_matrix + lVar42 + 0x7c)
    ;
    *(short *)((long)c_matrix + lVar42 + 0x7e) = sVar64 + *(short *)((long)c_matrix + lVar42 + 0x7e)
    ;
    *(short *)((long)cp_matrix + lVar42) = sVar66 + sVar70;
    *(short *)((long)cp_matrix + lVar42 + 2) = sVar67 + sVar17;
    *(short *)((long)cp_matrix + lVar42 + 4) = sVar68 + sVar18;
    *(short *)((long)cp_matrix + lVar42 + 6) = sVar69 + sVar19;
    lVar42 = lVar42 + 0x10;
  } while (lVar42 != 0x80);
  auVar92 = psllw(_auStack_48,0xd);
  auVar92 = auVar92 & _DAT_001dc110;
  auVar122 = psllw(_auStack_48,0xb);
  auVar122 = auVar122 & _DAT_001dc110;
  auVar61 = psllw(_auStack_48,9);
  auVar61 = auVar61 & _DAT_001dc110;
  auVar123 = psllw(_auStack_48,7);
  auVar123 = auVar123 & _DAT_001dc110;
  auVar74 = psllw(_auStack_48,5);
  auVar74 = auVar74 & _DAT_001dc110;
  auVar109 = psllw(_auStack_48,3);
  auVar109 = auVar109 & _DAT_001dc110;
  auVar82._2_2_ = auStack_48._2_2_ * 2;
  auVar82._0_2_ = auStack_48._0_2_ * 2;
  auVar82._4_2_ = auStack_48._4_2_ * 2;
  auVar82._6_2_ = auStack_48._6_2_ * 2;
  auVar82._8_2_ = auStack_48._8_2_ * 2;
  auVar82._10_2_ = auStack_48._10_2_ * 2;
  auVar82._12_2_ = auStack_48._12_2_ * 2;
  auVar82._14_2_ = auStack_48._14_2_ * 2;
  auVar82 = auVar82 & _DAT_001dc110;
  auVar85._0_2_ = auStack_48._0_2_ >> 1;
  auVar85._2_2_ = auStack_48._2_2_ >> 1;
  auVar85._4_2_ = auStack_48._4_2_ >> 1;
  auVar85._6_2_ = auStack_48._6_2_ >> 1;
  auVar85._8_2_ = auStack_48._8_2_ >> 1;
  auVar85._10_2_ = auStack_48._10_2_ >> 1;
  auVar85._12_2_ = auStack_48._12_2_ >> 1;
  auVar85._14_2_ = auStack_48._14_2_ >> 1;
  auVar85 = auVar85 & _DAT_001dc110;
  auVar99._0_12_ = auVar61._0_12_;
  auVar99._12_2_ = auVar61._6_2_;
  auVar99._14_2_ = auVar123._6_2_;
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._0_10_ = auVar61._0_10_;
  auVar98._10_2_ = auVar123._4_2_;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._0_8_ = auVar61._0_8_;
  auVar97._8_2_ = auVar61._4_2_;
  auVar35._4_8_ = auVar97._8_8_;
  auVar35._2_2_ = auVar123._2_2_;
  auVar35._0_2_ = auVar61._2_2_;
  auVar131._0_12_ = auVar92._0_12_;
  auVar131._12_2_ = auVar92._6_2_;
  auVar131._14_2_ = auVar122._6_2_;
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = auVar92._0_10_;
  auVar130._10_2_ = auVar122._4_2_;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = auVar92._0_8_;
  auVar129._8_2_ = auVar92._4_2_;
  auVar36._4_8_ = auVar129._8_8_;
  auVar36._2_2_ = auVar122._2_2_;
  auVar36._0_2_ = auVar92._2_2_;
  auVar128._0_4_ = CONCAT22(auVar122._0_2_,auVar92._0_2_);
  auVar128._4_12_ = auVar36;
  uVar101 = auVar35._0_4_;
  uVar120 = auVar36._0_4_;
  auVar117._0_8_ = auVar128._0_8_;
  auVar117._8_4_ = uVar120;
  auVar117._12_4_ = uVar101;
  auVar106._0_12_ = auVar74._0_12_;
  auVar106._12_2_ = auVar74._6_2_;
  auVar106._14_2_ = auVar109._6_2_;
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._0_10_ = auVar74._0_10_;
  auVar105._10_2_ = auVar109._4_2_;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._0_8_ = auVar74._0_8_;
  auVar104._8_2_ = auVar74._4_2_;
  auVar37._4_8_ = auVar104._8_8_;
  auVar37._2_2_ = auVar109._2_2_;
  auVar37._0_2_ = auVar74._2_2_;
  auVar103._0_4_ = CONCAT22(auVar109._0_2_,auVar74._0_2_);
  auVar103._4_12_ = auVar37;
  uVar59 = auVar104._8_4_;
  auVar126._0_12_ = auVar82._0_12_;
  auVar126._12_2_ = auVar82._6_2_;
  auVar126._14_2_ = auVar85._6_2_;
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._0_10_ = auVar82._0_10_;
  auVar125._10_2_ = auVar85._4_2_;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._0_8_ = auVar82._0_8_;
  auVar124._8_2_ = auVar82._4_2_;
  auVar38._4_8_ = auVar124._8_8_;
  auVar38._2_2_ = auVar85._2_2_;
  auVar38._0_2_ = auVar82._2_2_;
  uVar127 = auVar124._8_4_;
  auVar7._4_8_ = auVar117._8_8_;
  auVar7._0_4_ = uVar59;
  auVar118._0_8_ = auVar7._0_8_ << 0x20;
  auVar118._8_4_ = uVar59;
  auVar118._12_4_ = uVar59;
  auVar8._4_8_ = auVar118._8_8_;
  auVar8._0_4_ = uVar127;
  auVar119._0_8_ = auVar8._0_8_ << 0x20;
  auVar119._8_4_ = uVar59;
  auVar119._12_4_ = uVar127;
  uVar121 = auVar119._8_8_;
  uVar59 = CONCAT22(auVar123._8_2_,auVar61._8_2_);
  auVar60._0_8_ = CONCAT26(auVar123._10_2_,CONCAT24(auVar61._10_2_,uVar59));
  auVar60._8_2_ = auVar61._12_2_;
  auVar60._10_2_ = auVar123._12_2_;
  auVar62._12_2_ = auVar61._14_2_;
  auVar62._0_12_ = auVar60;
  auVar62._14_2_ = auVar123._14_2_;
  uVar90 = CONCAT22(auVar122._8_2_,auVar92._8_2_);
  auVar91._0_8_ = CONCAT26(auVar122._10_2_,CONCAT24(auVar92._10_2_,uVar90));
  auVar91._8_2_ = auVar92._12_2_;
  auVar91._10_2_ = auVar122._12_2_;
  auVar93._12_2_ = auVar92._14_2_;
  auVar93._0_12_ = auVar91;
  auVar93._14_2_ = auVar122._14_2_;
  uVar95 = (undefined4)((ulong)auVar91._0_8_ >> 0x20);
  uVar65 = (undefined4)((ulong)auVar60._0_8_ >> 0x20);
  uVar72 = CONCAT22(auVar109._8_2_,auVar74._8_2_);
  auVar73._0_8_ = CONCAT26(auVar109._10_2_,CONCAT24(auVar74._10_2_,uVar72));
  auVar73._8_2_ = auVar74._12_2_;
  auVar73._10_2_ = auVar109._12_2_;
  auVar75._12_2_ = auVar74._14_2_;
  auVar75._0_12_ = auVar73;
  auVar75._14_2_ = auVar109._14_2_;
  uVar77 = auVar73._8_4_;
  auVar9._4_8_ = auVar109._8_8_;
  auVar9._0_4_ = uVar72;
  auVar110._0_8_ = auVar9._0_8_ << 0x20;
  auVar110._8_4_ = uVar72;
  auVar110._12_4_ = uVar72;
  uVar80 = CONCAT22(auVar85._8_2_,auVar82._8_2_);
  auVar81._0_8_ = CONCAT26(auVar85._10_2_,CONCAT24(auVar82._10_2_,uVar80));
  auVar81._8_2_ = auVar82._12_2_;
  auVar81._10_2_ = auVar85._12_2_;
  auVar83._12_2_ = auVar82._14_2_;
  auVar83._0_12_ = auVar81;
  auVar83._14_2_ = auVar85._14_2_;
  uVar84 = auVar81._8_4_;
  auVar10._4_8_ = auVar85._8_8_;
  auVar10._0_4_ = uVar80;
  auVar86._0_8_ = auVar10._0_8_ << 0x20;
  auVar86._8_4_ = uVar80;
  auVar86._12_4_ = uVar80;
  auVar11._4_8_ = auVar110._8_8_;
  auVar11._0_4_ = uVar80;
  auVar111._0_8_ = auVar11._0_8_ << 0x20;
  auVar111._8_4_ = uVar72;
  auVar111._12_4_ = uVar80;
  uVar113 = auVar111._8_8_;
  auVar12._4_8_ = auVar86._8_8_;
  auVar12._0_4_ = uVar77;
  auVar87._0_8_ = auVar12._0_8_ << 0x20;
  auVar87._8_4_ = uVar77;
  auVar87._12_4_ = uVar77;
  auVar13._4_8_ = auVar87._8_8_;
  auVar13._0_4_ = uVar84;
  auVar88._0_8_ = auVar13._0_8_ << 0x20;
  auVar88._8_4_ = uVar77;
  auVar88._12_4_ = uVar84;
  uVar89 = auVar88._8_8_;
  auVar94._0_8_ = auVar103._0_8_;
  auVar94._8_4_ = auVar37._0_4_;
  auVar94._12_4_ = auVar38._0_4_;
  uVar96 = auVar94._8_8_;
  auVar14._4_8_ = auVar104._8_8_;
  auVar14._0_4_ = uVar127;
  auVar107._0_8_ = auVar14._0_8_ << 0x20;
  auVar107._8_4_ = auVar105._12_4_;
  auVar107._12_4_ = auVar125._12_4_;
  uVar108 = auVar107._8_8_;
  auVar100._8_4_ = (int)((ulong)auVar73._0_8_ >> 0x20);
  auVar100._0_8_ = auVar73._0_8_;
  auVar100._12_4_ = (int)((ulong)auVar81._0_8_ >> 0x20);
  uVar102 = auVar100._8_8_;
  auVar15._4_8_ = auVar75._8_8_;
  auVar15._0_4_ = uVar84;
  auVar109._0_8_ = auVar15._0_8_ << 0x20;
  auVar109._8_4_ = auVar75._12_4_;
  auVar109._12_4_ = auVar83._12_4_;
  uVar78 = auVar109._8_8_;
  mu_encode[0x34] = (uint16_t)auVar93._12_4_;
  mu_encode[0x35] = (uint16_t)((uint)auVar93._12_4_ >> 0x10);
  mu_encode[0x36] = (uint16_t)auVar62._12_4_;
  mu_encode[0x37] = (uint16_t)((uint)auVar62._12_4_ >> 0x10);
  mu_encode[0x38] = (uint16_t)uVar78;
  mu_encode[0x39] = SUB82(uVar78,2);
  mu_encode[0x3a] = SUB82(uVar78,4);
  mu_encode[0x3b] = SUB82(uVar78,6);
  mu_encode[0x24] = (uint16_t)uVar95;
  mu_encode[0x25] = (uint16_t)((uint)uVar95 >> 0x10);
  mu_encode[0x26] = (uint16_t)uVar65;
  mu_encode[0x27] = (uint16_t)((uint)uVar65 >> 0x10);
  mu_encode[0x28] = (uint16_t)uVar102;
  mu_encode[0x29] = SUB82(uVar102,2);
  mu_encode[0x2a] = SUB82(uVar102,4);
  mu_encode[0x2b] = SUB82(uVar102,6);
  mu_encode[0x14] = (uint16_t)auVar130._12_4_;
  mu_encode[0x15] = (uint16_t)((uint)auVar130._12_4_ >> 0x10);
  mu_encode[0x16] = (uint16_t)auVar98._12_4_;
  mu_encode[0x17] = (uint16_t)((uint)auVar98._12_4_ >> 0x10);
  mu_encode[0x18] = (uint16_t)uVar108;
  mu_encode[0x19] = SUB82(uVar108,2);
  mu_encode[0x1a] = SUB82(uVar108,4);
  mu_encode[0x1b] = SUB82(uVar108,6);
  mu_encode[4] = (uint16_t)uVar120;
  mu_encode[5] = (uint16_t)((uint)uVar120 >> 0x10);
  mu_encode[6] = (uint16_t)uVar101;
  mu_encode[7] = (uint16_t)((uint)uVar101 >> 0x10);
  mu_encode[8] = (uint16_t)uVar96;
  mu_encode[9] = SUB82(uVar96,2);
  mu_encode[10] = SUB82(uVar96,4);
  mu_encode[0xb] = SUB82(uVar96,6);
  mu_encode[0x2c] = (uint16_t)auVar91._8_4_;
  mu_encode[0x2d] = (uint16_t)((uint)auVar91._8_4_ >> 0x10);
  mu_encode[0x2e] = (uint16_t)auVar60._8_4_;
  mu_encode[0x2f] = (uint16_t)((uint)auVar60._8_4_ >> 0x10);
  mu_encode[0x30] = (uint16_t)uVar89;
  mu_encode[0x31] = SUB82(uVar89,2);
  mu_encode[0x32] = SUB82(uVar89,4);
  mu_encode[0x33] = SUB82(uVar89,6);
  mu_encode[0x1c] = auVar92._8_2_;
  mu_encode[0x1d] = auVar122._8_2_;
  mu_encode[0x1e] = auVar61._8_2_;
  mu_encode[0x1f] = (uint16_t)((uint)uVar59 >> 0x10);
  mu_encode[0x20] = (uint16_t)uVar113;
  mu_encode[0x21] = SUB82(uVar113,2);
  mu_encode[0x22] = SUB82(uVar113,4);
  mu_encode[0x23] = SUB82(uVar113,6);
  mu_encode[0xc] = (uint16_t)auVar129._8_4_;
  mu_encode[0xd] = (uint16_t)((uint)auVar129._8_4_ >> 0x10);
  mu_encode[0xe] = (uint16_t)auVar97._8_4_;
  mu_encode[0xf] = (uint16_t)((uint)auVar97._8_4_ >> 0x10);
  mu_encode[0x10] = (uint16_t)uVar121;
  mu_encode[0x11] = SUB82(uVar121,2);
  mu_encode[0x12] = SUB82(uVar121,4);
  mu_encode[0x13] = SUB82(uVar121,6);
  uStack_2e8 = CONCAT44(CONCAT22(auVar123._0_2_,auVar61._0_2_),auVar128._0_4_);
  mu_encode[0] = auVar74._0_2_;
  mu_encode[1] = (uint16_t)((uint)auVar103._0_4_ >> 0x10);
  mu_encode[2] = auVar82._0_2_;
  mu_encode[3] = auVar85._0_2_;
  lVar42 = 0;
  do {
    sVar58 = *(short *)((long)mu_encode + lVar42 + -6);
    sVar63 = *(short *)((long)mu_encode + lVar42 + -4);
    sVar64 = *(short *)((long)mu_encode + lVar42 + -2);
    sVar66 = *(short *)((long)mu_encode + lVar42);
    sVar67 = *(short *)((long)mu_encode + lVar42 + 2);
    sVar68 = *(short *)((long)mu_encode + lVar42 + 4);
    sVar69 = *(short *)((long)mu_encode + lVar42 + 6);
    sVar70 = *(short *)((long)cp_matrix + lVar42);
    sVar17 = *(short *)((long)cp_matrix + lVar42 + 2);
    sVar18 = *(short *)((long)cp_matrix + lVar42 + 4);
    sVar19 = *(short *)((long)cp_matrix + lVar42 + 6);
    *(short *)((long)c_matrix + lVar42 + 0x78) =
         *(short *)((long)mu_encode + lVar42 + -8) + *(short *)((long)c_matrix + lVar42 + 0x78);
    *(short *)((long)c_matrix + lVar42 + 0x7a) = sVar58 + *(short *)((long)c_matrix + lVar42 + 0x7a)
    ;
    *(short *)((long)c_matrix + lVar42 + 0x7c) = sVar63 + *(short *)((long)c_matrix + lVar42 + 0x7c)
    ;
    *(short *)((long)c_matrix + lVar42 + 0x7e) = sVar64 + *(short *)((long)c_matrix + lVar42 + 0x7e)
    ;
    *(short *)((long)cp_matrix + lVar42) = sVar66 + sVar70;
    *(short *)((long)cp_matrix + lVar42 + 2) = sVar67 + sVar17;
    *(short *)((long)cp_matrix + lVar42 + 4) = sVar68 + sVar18;
    *(short *)((long)cp_matrix + lVar42 + 6) = sVar69 + sVar19;
    lVar42 = lVar42 + 0x10;
  } while (lVar42 != 0x80);
  uStack_dc3e0 = 0x16c5c2;
  Lib_Memzero0_memzero0(&uStack_2e8,0x80);
  puVar43 = auStack_7b38;
  lVar42 = 0;
  do {
    lVar50 = 0;
    do {
      uVar49 = *(ulong *)((long)(puVar43 + lVar50) + 8);
      *(ulong *)(puVar43 + lVar50) = *(ulong *)(puVar43 + lVar50) & 0x7fff7fff7fff7fff;
      *(ulong *)((long)(puVar43 + lVar50) + 8) = uVar49 & 0x7fff7fff7fff7fff;
      lVar50 = lVar50 + 8;
    } while (lVar50 != 0x280);
    lVar42 = lVar42 + 1;
    puVar43 = puVar43 + 0x280;
  } while (lVar42 != 8);
  lVar42 = 0;
  do {
    uVar49 = *(ulong *)((long)cp_matrix + lVar42);
    *(ulong *)((long)c_matrix + lVar42 + 0x78) =
         *(ulong *)((long)c_matrix + lVar42 + 0x78) & 0x7fff7fff7fff7fff;
    *(ulong *)((long)cp_matrix + lVar42) = uVar49 & 0x7fff7fff7fff7fff;
    lVar42 = lVar42 + 0x10;
  } while (lVar42 != 0x80);
  uStack_dc3e0 = 0x16c634;
  Lib_Memzero0_memzero0(bpp_matrix + 0x13fc,0x2800);
  uStack_dc3e0 = 0x16c645;
  Lib_Memzero0_memzero0(b_matrix + 0x13fc,0x2800);
  uStack_dc3e0 = 0x16c656;
  Lib_Memzero0_memzero0(mu_encode + 0x3c,0x80);
  uVar48 = 0xffff;
  lVar42 = 0;
  do {
    uStack_dc3e0 = 0x16c674;
    uVar41 = FStar_UInt16_eq_mask
                       (*(uint16_t *)(auStack_2b36 + lVar42 * 2 + -2),auStack_7b38[lVar42]);
    uVar48 = uVar48 & uVar41;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x1400);
  uVar57 = 0xffff;
  lVar42 = 0;
  do {
    uStack_dc3e0 = 0x16c6a1;
    uVar41 = FStar_UInt16_eq_mask(m_matrix[lVar42 + 0x3c],c_matrix[lVar42 + 0x3c]);
    uVar57 = uVar57 & uVar41;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x40);
  uVar33 = *(uint *)(uVar40 + 8);
  uVar34 = *(uint *)(uVar40 + 0xc);
  uVar76 = (undefined1)((uVar57 & uVar48) >> 8);
  uVar71 = (undefined1)(uVar57 & uVar48);
  auVar61 = ZEXT416(CONCAT22(CONCAT11(uVar76,uVar76),CONCAT11(uVar71,uVar71)));
  auVar61 = pshuflw(auVar61,auVar61,0);
  uVar48 = auVar61._0_4_;
  uVar57 = uVar48 & seed_se_k._16_4_;
  uVar79 = uVar48 & seed_se_k._20_4_;
  seed_se_k._24_4_ = uVar48 & seed_se_k._8_4_ | ~uVar48 & *(uint *)uVar40;
  seed_se_k._28_4_ = uVar48 & seed_se_k._12_4_ | ~uVar48 & *(uint *)(uVar40 + 4);
  memcpy(auStack_de9e8,ct,0x25f8);
  uStack_dc3f0 = CONCAT44(seed_se_k._28_4_,seed_se_k._24_4_);
  uStack_dc3e8 = CONCAT44(uVar79 | ~uVar48 & uVar34,uVar57 | ~uVar48 & uVar33);
  Hacl_Hash_SHA3_shake128((uint8_t *)cp_matrix._120_8_,0x10,auStack_de9e8,0x2608);
  Lib_Memzero0_memzero0(auStack_de9e8,0x2608);
  Lib_Memzero0_memzero0(seed_se_k + 0x18,0x10);
  Lib_Memzero0_memzero0(auStack_318,0x20);
  Lib_Memzero0_memzero0(auStack_48,0x10);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss, uint8_t *ct, uint8_t *sk)
{
  uint16_t bp_matrix[5120U] = { 0U };
  uint16_t c_matrix[64U] = { 0U };
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 9600U;
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 640U, 15U, c1, bp_matrix);
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 8U, 15U, c2, c_matrix);
  uint8_t mu_decode[16U] = { 0U };
  uint8_t *s_bytes = sk + 9632U;
  uint16_t s_matrix[5120U] = { 0U };
  uint16_t m_matrix[64U] = { 0U };
  Hacl_Impl_Matrix_matrix_from_lbytes(640U, 8U, s_bytes, s_matrix);
  Hacl_Impl_Matrix_matrix_mul_s(8U, 640U, 8U, bp_matrix, s_matrix, m_matrix);
  Hacl_Impl_Matrix_matrix_sub(8U, 8U, c_matrix, m_matrix);
  Hacl_Impl_Frodo_Encode_frodo_key_decode(15U, 2U, 8U, m_matrix, mu_decode);
  Lib_Memzero0_memzero(s_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(m_matrix, 64U, uint16_t, void *);
  uint8_t seed_se_k[32U] = { 0U };
  uint32_t pkh_mu_decode_len = 32U;
  KRML_CHECK_SIZE(sizeof (uint8_t), pkh_mu_decode_len);
  uint8_t pkh_mu_decode[pkh_mu_decode_len];
  memset(pkh_mu_decode, 0U, pkh_mu_decode_len * sizeof (uint8_t));
  uint8_t *pkh = sk + 19872U;
  memcpy(pkh_mu_decode, pkh, 16U * sizeof (uint8_t));
  memcpy(pkh_mu_decode + 16U, mu_decode, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(seed_se_k, 32U, pkh_mu_decode, pkh_mu_decode_len);
  uint8_t *seed_se = seed_se_k;
  uint8_t *kp = seed_se_k + 16U;
  uint8_t *s = sk;
  uint16_t bpp_matrix[5120U] = { 0U };
  uint16_t cp_matrix[64U] = { 0U };
  uint16_t sp_matrix[5120U] = { 0U };
  uint16_t ep_matrix[5120U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[20608U] = { 0U };
  uint8_t shake_input_seed_se[17U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(r, 20608U, shake_input_seed_se, 17U);
  Lib_Memzero0_memzero(shake_input_seed_se, 17U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r + 10240U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 8U, r + 20480U, epp_matrix);
  uint8_t *pk = sk + 16U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  KRML_CHECK_SIZE(sizeof (uint16_t), 409600U);
  uint16_t a_matrix[409600U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 640U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 640U, sp_matrix, a_matrix, bpp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 640U, bpp_matrix, ep_matrix);
  uint16_t b_matrix[5120U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(640U, 8U, 15U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 8U, sp_matrix, b_matrix, cp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(15U, 2U, 8U, mu_decode, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Matrix_mod_pow2(8U, 640U, 15U, bpp_matrix);
  Hacl_Impl_Matrix_mod_pow2(8U, 8U, 15U, cp_matrix);
  Lib_Memzero0_memzero(sp_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint16_t b1 = Hacl_Impl_Matrix_matrix_eq(8U, 640U, bp_matrix, bpp_matrix);
  uint16_t b2 = Hacl_Impl_Matrix_matrix_eq(8U, 8U, c_matrix, cp_matrix);
  uint16_t mask = (uint32_t)b1 & (uint32_t)b2;
  uint16_t mask0 = mask;
  uint8_t kp_s[16U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint8_t *os = kp_s;
    uint8_t uu____0 = s[i];
    uint8_t
    x = (uint32_t)uu____0 ^ ((uint32_t)(uint8_t)mask0 & ((uint32_t)kp[i] ^ (uint32_t)uu____0));
    os[i] = x;);
  uint32_t ss_init_len = 9736U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t ss_init[ss_init_len];
  memset(ss_init, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(ss_init, ct, 9720U * sizeof (uint8_t));
  memcpy(ss_init + 9720U, kp_s, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(ss, 16U, ss_init, ss_init_len);
  Lib_Memzero0_memzero(ss_init, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(kp_s, 16U, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 32U, uint8_t, void *);
  Lib_Memzero0_memzero(mu_decode, 16U, uint8_t, void *);
  return 0U;
}